

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::vector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *other,
        polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *alloc)

{
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  size_t sVar2;
  undefined8 *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  undefined8 *in_RDI;
  size_t i;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  
  *in_RDI = *in_RDX;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  size(in_RSI);
  reserve(in_RSI,(size_t)in_RDX);
  local_20 = (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0;
  while( true ) {
    this_00 = local_20;
    ppVar1 = (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)size(in_RSI);
    if (ppVar1 <= this_00) break;
    p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        (in_RDI[1] + (long)local_20 * 0x20);
    operator[](in_RSI,(size_type)local_20);
    pmr::polymorphic_allocator<std::__cxx11::string>::
    construct<std::__cxx11::string,std::__cxx11::string_const&>
              (this_00,p,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7f0c6a);
    local_20 = (polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&local_20->memoryResource + 1);
  }
  sVar2 = size(in_RSI);
  in_RDI[3] = sVar2;
  return;
}

Assistant:

vector(const vector &other, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(other.size());
        for (size_t i = 0; i < other.size(); ++i)
            this->alloc.template construct<T>(ptr + i, other[i]);
        nStored = other.size();
    }